

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

Vector3D * __thiscall CMU462::Face::centroid(Vector3D *__return_storage_ptr__,Face *this)

{
  bool bVar1;
  pointer pHVar2;
  VertexIter *this_00;
  pointer pVVar3;
  HalfedgeIter *pHVar4;
  _List_iterator<CMU462::Halfedge> local_40;
  HalfedgeIter h;
  double d;
  Vector3D c;
  Face *this_local;
  
  c.z = (double)this;
  Vector3D::Vector3D((Vector3D *)&d,0.0,0.0,0.0);
  h._M_node = (_List_node_base *)0x0;
  local_40._M_node = (this->_halfedge)._M_node;
  do {
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_40);
    this_00 = Halfedge::vertex(pHVar2);
    pVVar3 = std::_List_iterator<CMU462::Vertex>::operator->(this_00);
    Vector3D::operator+=((Vector3D *)&d,&pVVar3->position);
    h._M_node = (_List_node_base *)(h._M_node + 1.0);
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_40);
    pHVar4 = Halfedge::next(pHVar2);
    local_40._M_node = pHVar4->_M_node;
    bVar1 = std::operator!=(&local_40,&this->_halfedge);
  } while (bVar1);
  Vector3D::operator/(__return_storage_ptr__,(Vector3D *)&d,(double *)&h);
  return __return_storage_ptr__;
}

Assistant:

Vector3D Face::centroid() const
  {
    Vector3D c( 0., 0., 0. );
    double d = 0.;

    // walk around the face
    HalfedgeIter h = _halfedge;
    do {
      c += h->vertex()->position;
      d += 1.;

      h = h->next();
    } while (h != _halfedge);  // done walking around the face

    return c / d;
  }